

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

SegmentReader * __thiscall capnp::_::ReaderArena::tryGetSegment(ReaderArena *this,SegmentId id)

{
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  *pMVar1;
  int iVar2;
  SegmentWordCount SVar3;
  undefined4 extraout_var;
  SegmentReader *pSVar4;
  word *extraout_RDX;
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_> *s;
  anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_2
  *this_00;
  ArrayPtr<const_capnp::word> segment;
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  lock;
  Own<capnp::_::SegmentReader,_std::nullptr_t> local_58;
  Mutex *local_48;
  Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_> *local_40;
  Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Callbacks>>
  local_38;
  undefined7 uStack_37;
  
  if (id.value == 0) {
    if ((this->segment0).ptr.size_ != 0) {
      return &this->segment0;
    }
    return (SegmentReader *)0x0;
  }
  pMVar1 = &this->moreSegments;
  local_38 = (Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Callbacks>>
              )0x0;
  this_00 = (anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_2
             *)0x0;
  kj::_::Mutex::lock(&pMVar1->mutex,0);
  local_40 = &(this->moreSegments).value;
  local_48 = &pMVar1->mutex;
  if ((this->moreSegments).value.ptr.isSet == true) {
    this_00 = &(this->moreSegments).value.ptr.field_1;
    kj::
    Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader,decltype(nullptr)>>::Callbacks>>
    ::find<0ul,unsigned_int&>(&local_38,(uint *)this_00);
    if (CONCAT71(uStack_37,local_38) != 0) {
      pSVar4 = *(SegmentReader **)(CONCAT71(uStack_37,local_38) + 0x10);
      goto LAB_0039726a;
    }
  }
  iVar2 = (*this->message->_vptr_MessageReader[2])();
  if (extraout_RDX == (word *)0x0) {
    pSVar4 = (SegmentReader *)0x0;
  }
  else {
    segment.size_ = (size_t)extraout_RDX;
    segment.ptr = extraout_RDX;
    SVar3 = verifySegment((_ *)CONCAT44(extraout_var,iVar2),segment);
    if ((local_40->ptr).isSet == false) {
      this_00 = &(local_40->ptr).field_1;
      (local_40->ptr).field_1.value.table.rows.builder.endPtr = (Entry *)0x0;
      (local_40->ptr).field_1.value.table.rows.builder.disposer = (ArrayDisposer *)0x0;
      (local_40->ptr).field_1.value.table.rows.builder.ptr = (Entry *)0x0;
      (local_40->ptr).field_1.value.table.rows.builder.pos =
           (RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)0x0;
      *(undefined8 *)&(local_40->ptr).field_1.value.table.indexes = 0;
      (local_40->ptr).field_1.value.table.rows.builder.disposer =
           (ArrayDisposer *)&kj::NullArrayDisposer::instance;
      (local_40->ptr).field_1.value.table.indexes.erasedCount = 0;
      (local_40->ptr).field_1.value.table.indexes.buckets.ptr = (HashBucket *)0x0;
      (local_40->ptr).field_1.value.table.indexes.buckets.size_ = 0;
      (local_40->ptr).field_1.value.table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
      (local_40->ptr).isSet = true;
    }
    pSVar4 = (SegmentReader *)operator_new(0x28);
    pSVar4->arena = &this->super_Arena;
    (pSVar4->id).value = id.value;
    (pSVar4->ptr).ptr = (word *)CONCAT44(extraout_var,iVar2);
    (pSVar4->ptr).size_ = (ulong)SVar3;
    pSVar4->readLimiter = &this->readLimiter;
    local_58.disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentReader>::instance;
    local_58.ptr = pSVar4;
    kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>::insert
              (&this_00->value,id.value,&local_58);
    if (local_58.ptr != (SegmentReader *)0x0) {
      local_58.ptr = (SegmentReader *)0x0;
      (**(local_58.disposer)->_vptr_Disposer)();
    }
  }
LAB_0039726a:
  if (local_48 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(local_48,EXCLUSIVE,(Waiter *)0x0);
  }
  return pSVar4;
}

Assistant:

SegmentReader* ReaderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArray() == nullptr) {
      return nullptr;
    } else {
      return &segment0;
    }
  }

  auto lock = moreSegments.lockExclusive();

  SegmentMap* segments = nullptr;
  KJ_IF_SOME(s, *lock) {
    KJ_IF_SOME(segment, s.find(id.value)) {
      return segment;
    }
    segments = &s;
  }

  kj::ArrayPtr<const word> newSegment = message->getSegment(id.value);
  if (newSegment == nullptr) {
    return nullptr;
  }

  SegmentWordCount newSegmentSize = verifySegment(newSegment);

  if (*lock == kj::none) {
    // OK, the segment exists, so allocate the map.
    segments = &lock->emplace();
  }

  auto segment = kj::heap<SegmentReader>(
      this, id, newSegment.begin(), newSegmentSize, &readLimiter);
  SegmentReader* result = segment;
  segments->insert(id.value, kj::mv(segment));
  return result;
}